

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

uint256 * ComputeTapbranchHash(Span<const_unsigned_char> a,Span<const_unsigned_char> b)

{
  bool bVar1;
  HashWriter *this;
  uchar *__last1;
  uchar *__first1;
  Span<const_unsigned_char> *in_RDI;
  long in_FS_OFFSET;
  HashWriter ss_branch;
  Span<const_unsigned_char> *obj;
  undefined1 local_70 [104];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  obj = in_RDI;
  memcpy(local_70,&HASHER_TAPBRANCH,0x68);
  this = (HashWriter *)Span<const_unsigned_char>::begin(in_RDI);
  __last1 = Span<const_unsigned_char>::end(in_RDI);
  __first1 = Span<const_unsigned_char>::begin(in_RDI);
  Span<const_unsigned_char>::end(in_RDI);
  bVar1 = std::lexicographical_compare<unsigned_char_const*,unsigned_char_const*>
                    (__first1,__last1,(uchar *)this,(uchar *)obj);
  if (bVar1) {
    HashWriter::operator<<(this,obj);
    HashWriter::operator<<(this,obj);
  }
  else {
    HashWriter::operator<<(this,obj);
    HashWriter::operator<<(this,obj);
  }
  HashWriter::GetSHA256(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (uint256 *)obj;
  }
  __stack_chk_fail();
}

Assistant:

uint256 ComputeTapbranchHash(Span<const unsigned char> a, Span<const unsigned char> b)
{
    HashWriter ss_branch{HASHER_TAPBRANCH};
    if (std::lexicographical_compare(a.begin(), a.end(), b.begin(), b.end())) {
        ss_branch << a << b;
    } else {
        ss_branch << b << a;
    }
    return ss_branch.GetSHA256();
}